

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
DatabaseSnapshot::find_compact_candidate_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,DatabaseSnapshot *this,bool smart)

{
  pointer ppOVar1;
  pointer ppOVar2;
  bool bVar3;
  OnDiskDataset **candidate;
  uint64_t uVar4;
  uint64_t uVar5;
  pointer ppOVar6;
  ulong uVar7;
  long lVar8;
  unsigned_long *in_R8;
  __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
  __i;
  pointer datasets;
  pointer ppOVar9;
  long lVar10;
  ulong uVar11;
  string_view dataset_id;
  string_view_t fmt;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> ready_candidates;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> best_compact;
  long local_d0;
  int64_t best_compact_value;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> candidates;
  ConfigKey local_80;
  vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
  local_48;
  
  ConfigKey::merge_max_datasets();
  uVar4 = DatabaseConfig::get(&this->config,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  ConfigKey::merge_max_files();
  uVar5 = DatabaseConfig::get(&this->config,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  best_compact.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  best_compact.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  best_compact.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0 = -0x8000000000000000;
  best_compact_value = -0x8000000000000000;
  OnDiskDataset::get_compatible_datasets(&local_48,&this->datasets);
  for (datasets = local_48.
                  super__Vector_base<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      datasets !=
      local_48.
      super__Vector_base<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; datasets = datasets + 1) {
    candidates.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    candidates.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    candidates.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (smart) {
      OnDiskDataset::get_compact_candidates
                ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)&local_80,
                 datasets);
      std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::_M_move_assign
                (&candidates,&local_80);
      std::_Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::
      ~_Vector_base((_Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                    &local_80);
    }
    else {
      std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::_M_move_assign
                (&candidates,datasets);
    }
    ppOVar6 = candidates.
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ready_candidates.
    super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ready_candidates.
    super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ready_candidates.
    super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (ppOVar9 = candidates.
                   super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppOVar2 = ready_candidates.
                  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish,
        ppOVar1 = ready_candidates.
                  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
                  _M_impl.super__Vector_impl_data._M_start, ppOVar9 != ppOVar6;
        ppOVar9 = ppOVar9 + 1) {
      OnDiskDataset::get_id_abi_cxx11_(&local_80.key_,*ppOVar9);
      dataset_id._M_str = local_80.key_._M_dataplus._M_p;
      dataset_id._M_len = local_80.key_._M_string_length;
      bVar3 = is_dataset_locked(&this->tasks,dataset_id);
      std::__cxx11::string::~string((string *)&local_80);
      if (!bVar3) {
        std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::push_back
                  (&ready_candidates,ppOVar9);
      }
    }
    uVar11 = 0;
    for (ppOVar6 = ready_candidates.
                   super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppOVar6 !=
        ready_candidates.
        super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppOVar6 = ppOVar6 + 1) {
      uVar11 = uVar11 + ((*ppOVar6)->files_index).
                        super__Optional_base<OnDiskFileIndex,_false,_false>._M_payload.
                        super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
                        super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.file_count
      ;
    }
    if (ready_candidates.
        super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        ready_candidates.
        super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar10 = (long)ready_candidates.
                     super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)ready_candidates.
                     super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = lVar10 >> 3;
      lVar8 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<OnDiskDataset_const**,std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<DatabaseSnapshot::find_compact_candidate[abi:cxx11](bool)const::__0>>
                (ready_candidates.
                 super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 ready_candidates.
                 super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar10 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<OnDiskDataset_const**,std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<DatabaseSnapshot::find_compact_candidate[abi:cxx11](bool)const::__0>>
                  (ppOVar1,ppOVar2);
      }
      else {
        ppOVar6 = ppOVar1 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<OnDiskDataset_const**,std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<DatabaseSnapshot::find_compact_candidate[abi:cxx11](bool)const::__0>>
                  (ppOVar1,ppOVar6);
        for (; ppOVar6 != ppOVar2; ppOVar6 = ppOVar6 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<OnDiskDataset_const**,std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<DatabaseSnapshot::find_compact_candidate[abi:cxx11](bool)const::__0>>
                    (ppOVar6);
        }
      }
    }
    lVar8 = (long)ready_candidates.
                  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)ready_candidates.
                  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      uVar7 = lVar8 >> 3;
      if ((uVar7 <= uVar4) && (uVar11 <= uVar5)) break;
      uVar11 = uVar11 - (ready_candidates.
                         super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1]->files_index).
                        super__Optional_base<OnDiskFileIndex,_false,_false>._M_payload.
                        super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
                        super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.file_count
      ;
      lVar8 = lVar8 + -8;
      ready_candidates.
      super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           ready_candidates.
           super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl
           .super__Vector_impl_data._M_finish + -1;
    }
    if (1 < uVar7) {
      lVar8 = uVar7 - uVar11 / uVar7;
      if (local_d0 < lVar8) {
        best_compact_value = lVar8;
        std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::_M_move_assign
                  (&best_compact,&ready_candidates,uVar11 % uVar7);
        local_d0 = lVar8;
      }
    }
    std::_Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~_Vector_base
              (&ready_candidates.
                super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>);
    std::_Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~_Vector_base
              (&candidates.
                super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>);
  }
  std::
  vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
  ::~vector(&local_48);
  if (best_compact.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      best_compact.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    spdlog::debug<char[37]>((char (*) [37])"No suitable compact candidate found.");
  }
  else {
    local_80.key_._M_dataplus._M_p =
         (pointer)((long)best_compact.
                         super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)best_compact.
                         super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
    fmt.size_ = (size_t)&best_compact_value;
    fmt.data_ = (char *)0x28;
    spdlog::debug<long,unsigned_long>
              ((spdlog *)"Good candidate (cost: {}, datasets: {}).",fmt,(long *)&local_80,in_R8);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,
            (long)best_compact.
                  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)best_compact.
                  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3);
  ppOVar6 = best_compact.
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppOVar9 = best_compact.
                 super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppOVar9 != ppOVar6; ppOVar9 = ppOVar9 + 1
      ) {
    OnDiskDataset::get_id_abi_cxx11_(&local_80.key_,*ppOVar9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_80.key_);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::_Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~_Vector_base
            (&best_compact.
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> DatabaseSnapshot::find_compact_candidate(
    bool smart) const {
    const uint64_t max_datasets = config.get(ConfigKey::merge_max_datasets());
    const uint64_t max_files = config.get(ConfigKey::merge_max_files());

    // Try to find a best compact candidate. As a rating function, we use
    // "number of datasets" - "average number of files", because we want to
    // maximise number of datasets being compacted and minimise number of
    // files being compacted (we want to compact small datasets first).
    std::vector<const OnDiskDataset *> best_compact;
    int64_t best_compact_value = std::numeric_limits<int64_t>::min();
    for (auto &set : OnDiskDataset::get_compatible_datasets(datasets)) {
        // Check every set of compatible datasets.
        std::vector<const OnDiskDataset *> candidates;
        if (smart) {
            // When we're trying to be smart, ignore too small sets.
            candidates = std::move(OnDiskDataset::get_compact_candidates(set));
        } else {
            candidates = std::move(set);
        }

        // Ignore datasets that are locked.
        std::vector<const OnDiskDataset *> ready_candidates;
        for (const auto &candidate : candidates) {
            if (!is_dataset_locked(tasks, candidate->get_id())) {
                ready_candidates.push_back(candidate);
            }
        }

        // Compute number of files in this dataset.
        uint64_t number_of_files = 0;
        for (const auto &candidate : ready_candidates) {
            number_of_files += candidate->get_file_count();
        }

        // Check for allowed maximum merge values. If they are exceeded, try to
        // merge small datasets first.
        std::sort(ready_candidates.begin(), ready_candidates.end(),
                  [](const auto &lhs, const auto &rhs) {
                      return lhs->get_file_count() < rhs->get_file_count();
                  });
        while (ready_candidates.size() > max_datasets ||
               number_of_files > max_files) {
            number_of_files -= ready_candidates.back()->get_file_count();
            ready_candidates.pop_back();
        }

        // It doesn't make sense to merge less than 2 datasets.
        if (ready_candidates.size() < 2) {
            continue;
        }

        // Compute compact_value for this set, and maybe update best candidate.
        uint64_t avg_files = number_of_files / ready_candidates.size();
        int64_t compact_value = ready_candidates.size() - avg_files;
        if (compact_value > best_compact_value) {
            best_compact_value = compact_value;
            best_compact = std::move(ready_candidates);
        }
    }

    if (best_compact.empty()) {
        spdlog::debug("No suitable compact candidate found.");
    } else {
        spdlog::debug("Good candidate (cost: {}, datasets: {}).",
                      best_compact_value, best_compact.size());
    }

    std::vector<std::string> names;
    names.reserve(best_compact.size());
    for (const auto &ds : best_compact) {
        names.emplace_back(ds->get_id());
    }

    return names;
}